

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O0

void __thiscall
validation_chainstatemanager_tests::chainstatemanager_args::test_method
          (chainstatemanager_args *this)

{
  string_view str;
  string_view str_00;
  initializer_list<const_char_*> __l;
  initializer_list<const_char_*> __l_00;
  initializer_list<const_char_*> __l_01;
  initializer_list<const_char_*> __l_02;
  initializer_list<const_char_*> __l_03;
  initializer_list<const_char_*> __l_04;
  initializer_list<const_char_*> __l_05;
  initializer_list<const_char_*> __l_06;
  initializer_list<const_char_*> __l_07;
  initializer_list<const_char_*> __l_08;
  initializer_list<const_char_*> __l_09;
  initializer_list<const_char_*> __l_10;
  initializer_list<const_char_*> __l_11;
  bool bVar1;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffe658;
  uint256 *in_stack_ffffffffffffe660;
  char *in_stack_ffffffffffffe668;
  uint256 *in_stack_ffffffffffffe670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe678;
  undefined7 in_stack_ffffffffffffe680;
  undefined1 in_stack_ffffffffffffe687;
  lazy_ostream *in_stack_ffffffffffffe688;
  const_string *in_stack_ffffffffffffe690;
  allocator<char> *in_stack_ffffffffffffe698;
  vector<const_char_*,_std::allocator<const_char_*>_> *this_00;
  undefined7 in_stack_ffffffffffffe6a0;
  undefined1 in_stack_ffffffffffffe6a7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe6a8;
  chainstatemanager_args *this_local;
  const_string local_15c8 [2];
  lazy_ostream local_15a8 [2];
  const_string local_1581;
  assertion_result local_1568 [2];
  const_string local_1530 [2];
  lazy_ostream local_1510 [4];
  assertion_result local_14d0 [3];
  undefined1 local_1478 [16];
  undefined1 local_1468 [70];
  allocator<char> local_1422 [26];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [96];
  undefined1 local_1398 [16];
  undefined1 local_1388 [96];
  undefined1 local_1328 [16];
  undefined1 local_1318 [64];
  const_string local_12d8 [2];
  lazy_ostream local_12b8 [2];
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  assertion_result local_1280 [2];
  const_string local_1248 [2];
  lazy_ostream local_1228 [4];
  assertion_result local_11e8 [2];
  const_string local_11b0 [2];
  lazy_ostream local_1190 [4];
  assertion_result local_1150 [3];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [70];
  allocator<char> local_10a2 [26];
  undefined1 local_1088 [16];
  undefined1 local_1078 [96];
  undefined1 local_1018 [16];
  undefined1 local_1008 [8];
  undefined8 local_1000;
  undefined1 local_fa8 [16];
  undefined1 local_f98 [96];
  undefined1 local_f38 [16];
  undefined1 local_f28 [64];
  const_string local_ee8 [2];
  lazy_ostream local_ec8 [2];
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  assertion_result local_e88 [2];
  anon_class_8_1_5dbb9ce7 get_valid_opts;
  anon_class_8_1_8991fb9c get_opts;
  lazy_ostream local_c58 [4];
  char *local_c18;
  undefined1 local_bd4 [148];
  string minimum_chainwork;
  lazy_ostream local_b20 [2];
  char *local_b00;
  undefined1 local_abc [148];
  lazy_ostream local_a28;
  undefined8 local_a18;
  undefined8 uStack_a10;
  char *local_a00;
  undefined1 local_9bc [148];
  lazy_ostream local_928;
  undefined8 local_918;
  undefined8 uStack_910;
  char *local_900;
  undefined1 local_8bc [356];
  char *local_758;
  char *local_678;
  lazy_ostream local_591 [4];
  char *local_550;
  undefined1 local_4e8 [112];
  string assume_valid;
  lazy_ostream local_458 [2];
  char *local_438;
  undefined1 local_3d0 [112];
  char *local_360;
  undefined1 local_2f8 [112];
  char *local_288;
  undefined1 local_220 [112];
  char *local_1b0;
  undefined1 local_148 [320];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  get_valid_opts.get_opts = &get_opts;
  get_opts.this = this;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe698,in_stack_ffffffffffffe690,
               (size_t)in_stack_ffffffffffffe688,
               (const_string *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    local_ea8 = 0;
    uStack_ea0 = 0;
    local_e98 = 0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe658);
    test_method::anon_class_8_1_5dbb9ce7::operator()
              ((anon_class_8_1_5dbb9ce7 *)
               CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
               (vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698);
    std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_ffffffffffffe658);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe668,
               SUB81((ulong)in_stack_ffffffffffffe660 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe660,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    in_stack_ffffffffffffe658 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e88,local_ec8,local_ee8,0x329,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe658);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe658);
    kernel::ChainstateManagerOpts::~ChainstateManagerOpts
              ((ChainstateManagerOpts *)in_stack_ffffffffffffe658);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe668);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe698,in_stack_ffffffffffffe690,
               (size_t)in_stack_ffffffffffffe688,
               (const_string *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe660,(char (*) [1])in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    local_1b0 = "-assumevalid=";
    std::allocator<const_char_*>::allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    __l._M_array._7_1_ = in_stack_ffffffffffffe6a7;
    __l._M_array._0_7_ = in_stack_ffffffffffffe6a0;
    __l._M_len = (size_type)in_stack_ffffffffffffe6a8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698,__l,
               (allocator_type *)in_stack_ffffffffffffe690);
    test_method::anon_class_8_1_5dbb9ce7::operator()
              ((anon_class_8_1_5dbb9ce7 *)
               CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
               (vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698);
    in_stack_ffffffffffffe668 = "uint256::ZERO";
    in_stack_ffffffffffffe660 = &uint256::ZERO;
    in_stack_ffffffffffffe658 = "get_valid_opts({\"-assumevalid=\"}).assumed_valid_block";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
              (local_f28,local_f38,0x32a,1,2,local_148);
    kernel::ChainstateManagerOpts::~ChainstateManagerOpts
              ((ChainstateManagerOpts *)in_stack_ffffffffffffe658);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe668);
    std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe698,in_stack_ffffffffffffe690,
               (size_t)in_stack_ffffffffffffe688,
               (const_string *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe660,(char (*) [1])in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    local_288 = "-assumevalid=0";
    std::allocator<const_char_*>::allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    __l_00._M_array._7_1_ = in_stack_ffffffffffffe6a7;
    __l_00._M_array._0_7_ = in_stack_ffffffffffffe6a0;
    __l_00._M_len = (size_type)in_stack_ffffffffffffe6a8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698,
               __l_00,(allocator_type *)in_stack_ffffffffffffe690);
    test_method::anon_class_8_1_5dbb9ce7::operator()
              ((anon_class_8_1_5dbb9ce7 *)
               CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
               (vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698);
    in_stack_ffffffffffffe668 = "uint256::ZERO";
    in_stack_ffffffffffffe660 = &uint256::ZERO;
    in_stack_ffffffffffffe658 = "get_valid_opts({\"-assumevalid=0\"}).assumed_valid_block";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
              (local_f98,local_fa8,0x32b,1,2,local_220);
    kernel::ChainstateManagerOpts::~ChainstateManagerOpts
              ((ChainstateManagerOpts *)in_stack_ffffffffffffe658);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe668);
    std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe698,in_stack_ffffffffffffe690,
               (size_t)in_stack_ffffffffffffe688,
               (const_string *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe660,(char (*) [1])in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    local_360 = "-noassumevalid";
    std::allocator<const_char_*>::allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    __l_01._M_array._7_1_ = in_stack_ffffffffffffe6a7;
    __l_01._M_array._0_7_ = in_stack_ffffffffffffe6a0;
    __l_01._M_len = (size_type)in_stack_ffffffffffffe6a8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698,
               __l_01,(allocator_type *)in_stack_ffffffffffffe690);
    test_method::anon_class_8_1_5dbb9ce7::operator()
              ((anon_class_8_1_5dbb9ce7 *)
               CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
               (vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698);
    in_stack_ffffffffffffe668 = "uint256::ZERO";
    in_stack_ffffffffffffe660 = &uint256::ZERO;
    in_stack_ffffffffffffe658 = "get_valid_opts({\"-noassumevalid\"}).assumed_valid_block";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
              (local_1008,local_1018,0x32c,1,2,local_2f8);
    kernel::ChainstateManagerOpts::~ChainstateManagerOpts
              ((ChainstateManagerOpts *)in_stack_ffffffffffffe658);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe668);
    std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe698,in_stack_ffffffffffffe690,
               (size_t)in_stack_ffffffffffffe688,
               (const_string *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe660,(char (*) [1])in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    local_438 = "-assumevalid=0x12";
    std::allocator<const_char_*>::allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    __l_02._M_array._7_1_ = in_stack_ffffffffffffe6a7;
    __l_02._M_array._0_7_ = in_stack_ffffffffffffe6a0;
    __l_02._M_len = (size_type)in_stack_ffffffffffffe6a8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698,
               __l_02,(allocator_type *)in_stack_ffffffffffffe690);
    test_method::anon_class_8_1_5dbb9ce7::operator()
              ((anon_class_8_1_5dbb9ce7 *)
               CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
               (vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698);
    uint256::uint256((uint256 *)in_stack_ffffffffffffe658,'\0');
    in_stack_ffffffffffffe668 = "uint256{0x12}";
    in_stack_ffffffffffffe660 = (uint256 *)local_458;
    in_stack_ffffffffffffe658 = "get_valid_opts({\"-assumevalid=0x12\"}).assumed_valid_block";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,uint256>
              (local_1078,local_1088,0x32d,1,2,local_3d0);
    kernel::ChainstateManagerOpts::~ChainstateManagerOpts
              ((ChainstateManagerOpts *)in_stack_ffffffffffffe658);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe668);
    std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe6a8,
             (char *)CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
             in_stack_ffffffffffffe698);
  std::allocator<char>::~allocator(local_10a2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe698,in_stack_ffffffffffffe690,
               (size_t)in_stack_ffffffffffffe688,
               (const_string *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe660,(char (*) [1])in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    std::operator+((char *)in_stack_ffffffffffffe6a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0));
    local_550 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffe658);
    std::allocator<const_char_*>::allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    __l_03._M_array._7_1_ = in_stack_ffffffffffffe6a7;
    __l_03._M_array._0_7_ = in_stack_ffffffffffffe6a0;
    __l_03._M_len = (size_type)in_stack_ffffffffffffe6a8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698,
               __l_03,(allocator_type *)in_stack_ffffffffffffe690);
    test_method::anon_class_8_1_5dbb9ce7::operator()
              ((anon_class_8_1_5dbb9ce7 *)
               CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
               (vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe678);
    str._M_str = (char *)in_stack_ffffffffffffe678;
    str._M_len = (size_t)in_stack_ffffffffffffe670;
    uint256::FromHex(str);
    in_stack_ffffffffffffe668 = "uint256::FromHex(assume_valid)";
    in_stack_ffffffffffffe660 = (uint256 *)local_591;
    in_stack_ffffffffffffe658 =
         "get_valid_opts({(\"-assumevalid=\" + assume_valid).c_str()}).assumed_valid_block";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<uint256>,std::optional<uint256>>
              (local_10e8,local_10f8,0x330,1,2,local_4e8);
    kernel::ChainstateManagerOpts::~ChainstateManagerOpts
              ((ChainstateManagerOpts *)in_stack_ffffffffffffe658);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe668);
    std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe658);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe698,in_stack_ffffffffffffe690,
               (size_t)in_stack_ffffffffffffe688,
               (const_string *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    local_678 = "-assumevalid=xyz";
    std::allocator<const_char_*>::allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    __l_04._M_array._7_1_ = in_stack_ffffffffffffe6a7;
    __l_04._M_array._0_7_ = in_stack_ffffffffffffe6a0;
    __l_04._M_len = (size_type)in_stack_ffffffffffffe6a8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698,
               __l_04,(allocator_type *)in_stack_ffffffffffffe690);
    test_method::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)
               CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
               (vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698);
    util::Result::operator_cast_to_bool
              ((Result<kernel::ChainstateManagerOpts> *)in_stack_ffffffffffffe658);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe668,
               SUB81((ulong)in_stack_ffffffffffffe660 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe660,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    in_stack_ffffffffffffe658 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1150,local_1190,local_11b0,0x332,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe658);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe658);
    util::Result<kernel::ChainstateManagerOpts>::~Result
              ((Result<kernel::ChainstateManagerOpts> *)in_stack_ffffffffffffe658);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe668);
    std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe698,in_stack_ffffffffffffe690,
               (size_t)in_stack_ffffffffffffe688,
               (const_string *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    local_758 = "-assumevalid=01234567890123456789012345678901234567890123456789012345678901234";
    std::allocator<const_char_*>::allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    __l_05._M_array._7_1_ = in_stack_ffffffffffffe6a7;
    __l_05._M_array._0_7_ = in_stack_ffffffffffffe6a0;
    __l_05._M_len = (size_type)in_stack_ffffffffffffe6a8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698,
               __l_05,(allocator_type *)in_stack_ffffffffffffe690);
    test_method::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)
               CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
               (vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698);
    util::Result::operator_cast_to_bool
              ((Result<kernel::ChainstateManagerOpts> *)in_stack_ffffffffffffe658);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe668,
               SUB81((ulong)in_stack_ffffffffffffe660 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe660,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    in_stack_ffffffffffffe658 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_11e8,local_1228,local_1248,0x333,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe658);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe658);
    util::Result<kernel::ChainstateManagerOpts>::~Result
              ((Result<kernel::ChainstateManagerOpts> *)in_stack_ffffffffffffe658);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe668);
    std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe698,in_stack_ffffffffffffe690,
               (size_t)in_stack_ffffffffffffe688,
               (const_string *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    local_1298 = 0;
    uStack_1290 = 0;
    local_1288 = 0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe658);
    test_method::anon_class_8_1_5dbb9ce7::operator()
              ((anon_class_8_1_5dbb9ce7 *)
               CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
               (vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698);
    std::optional::operator_cast_to_bool((optional<arith_uint256> *)in_stack_ffffffffffffe658);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe668,
               SUB81((ulong)in_stack_ffffffffffffe660 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe660,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    in_stack_ffffffffffffe658 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1280,local_12b8,local_12d8,0x336,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe658);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe658);
    kernel::ChainstateManagerOpts::~ChainstateManagerOpts
              ((ChainstateManagerOpts *)in_stack_ffffffffffffe658);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe668);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe698,in_stack_ffffffffffffe690,
               (size_t)in_stack_ffffffffffffe688,
               (const_string *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe660,(char (*) [1])in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    local_900 = "-minimumchainwork=0";
    std::allocator<const_char_*>::allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    __l_06._M_array._7_1_ = in_stack_ffffffffffffe6a7;
    __l_06._M_array._0_7_ = in_stack_ffffffffffffe6a0;
    __l_06._M_len = (size_type)in_stack_ffffffffffffe6a8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698,
               __l_06,(allocator_type *)in_stack_ffffffffffffe690);
    test_method::anon_class_8_1_5dbb9ce7::operator()
              ((anon_class_8_1_5dbb9ce7 *)
               CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
               (vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698);
    local_918 = 0;
    uStack_910 = 0;
    local_928._vptr_lazy_ostream = (_func_int **)0x0;
    local_928.m_empty = false;
    local_928._9_7_ = 0;
    arith_uint256::arith_uint256((arith_uint256 *)in_stack_ffffffffffffe658);
    in_stack_ffffffffffffe668 = "arith_uint256()";
    in_stack_ffffffffffffe660 = (uint256 *)&local_928;
    in_stack_ffffffffffffe658 = "get_valid_opts({\"-minimumchainwork=0\"}).minimum_chain_work";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<arith_uint256>,arith_uint256>
              (local_1318,local_1328,0x337,1,2,local_8bc);
    kernel::ChainstateManagerOpts::~ChainstateManagerOpts
              ((ChainstateManagerOpts *)in_stack_ffffffffffffe658);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe668);
    std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe698,in_stack_ffffffffffffe690,
               (size_t)in_stack_ffffffffffffe688,
               (const_string *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe660,(char (*) [1])in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    local_a00 = "-nominimumchainwork";
    std::allocator<const_char_*>::allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    __l_07._M_array._7_1_ = in_stack_ffffffffffffe6a7;
    __l_07._M_array._0_7_ = in_stack_ffffffffffffe6a0;
    __l_07._M_len = (size_type)in_stack_ffffffffffffe6a8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698,
               __l_07,(allocator_type *)in_stack_ffffffffffffe690);
    test_method::anon_class_8_1_5dbb9ce7::operator()
              ((anon_class_8_1_5dbb9ce7 *)
               CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
               (vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698);
    local_a18 = 0;
    uStack_a10 = 0;
    local_a28._vptr_lazy_ostream = (_func_int **)0x0;
    local_a28.m_empty = false;
    local_a28._9_7_ = 0;
    arith_uint256::arith_uint256((arith_uint256 *)in_stack_ffffffffffffe658);
    in_stack_ffffffffffffe668 = "arith_uint256()";
    in_stack_ffffffffffffe660 = (uint256 *)&local_a28;
    in_stack_ffffffffffffe658 = "get_valid_opts({\"-nominimumchainwork\"}).minimum_chain_work";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<arith_uint256>,arith_uint256>
              (local_1388,local_1398,0x338,1,2,local_9bc);
    kernel::ChainstateManagerOpts::~ChainstateManagerOpts
              ((ChainstateManagerOpts *)in_stack_ffffffffffffe658);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe668);
    std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe698,in_stack_ffffffffffffe690,
               (size_t)in_stack_ffffffffffffe688,
               (const_string *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe660,(char (*) [1])in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    local_b00 = "-minimumchainwork=0x1234";
    std::allocator<const_char_*>::allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    __l_08._M_array._7_1_ = in_stack_ffffffffffffe6a7;
    __l_08._M_array._0_7_ = in_stack_ffffffffffffe6a0;
    __l_08._M_len = (size_type)in_stack_ffffffffffffe6a8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698,
               __l_08,(allocator_type *)in_stack_ffffffffffffe690);
    test_method::anon_class_8_1_5dbb9ce7::operator()
              ((anon_class_8_1_5dbb9ce7 *)
               CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
               (vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698);
    arith_uint256::arith_uint256((arith_uint256 *)in_stack_ffffffffffffe658,0xcdcd09);
    in_stack_ffffffffffffe668 = "arith_uint256{0x1234}";
    in_stack_ffffffffffffe660 = (uint256 *)local_b20;
    in_stack_ffffffffffffe658 = "get_valid_opts({\"-minimumchainwork=0x1234\"}).minimum_chain_work";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<arith_uint256>,arith_uint256>
              (local_13f8,local_1408,0x339,1,2,local_abc);
    kernel::ChainstateManagerOpts::~ChainstateManagerOpts
              ((ChainstateManagerOpts *)in_stack_ffffffffffffe658);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe668);
    std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe6a8,
             (char *)CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
             in_stack_ffffffffffffe698);
  std::allocator<char>::~allocator(local_1422);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe698,in_stack_ffffffffffffe690,
               (size_t)in_stack_ffffffffffffe688,
               (const_string *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe660,(char (*) [1])in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    std::operator+((char *)in_stack_ffffffffffffe6a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0));
    local_c18 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffe658);
    std::allocator<const_char_*>::allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    __l_09._M_array._7_1_ = in_stack_ffffffffffffe6a7;
    __l_09._M_array._0_7_ = in_stack_ffffffffffffe6a0;
    __l_09._M_len = (size_type)in_stack_ffffffffffffe6a8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698,
               __l_09,(allocator_type *)in_stack_ffffffffffffe690);
    test_method::anon_class_8_1_5dbb9ce7::operator()
              ((anon_class_8_1_5dbb9ce7 *)
               CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
               (vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffe678);
    str_00._M_str = (char *)in_stack_ffffffffffffe678;
    str_00._M_len = (size_t)in_stack_ffffffffffffe670;
    uint256::FromHex(str_00);
    std::optional<uint256>::value((optional<uint256> *)in_stack_ffffffffffffe668);
    UintToArith256(in_stack_ffffffffffffe670);
    in_stack_ffffffffffffe668 = "UintToArith256(uint256::FromHex(minimum_chainwork).value())";
    in_stack_ffffffffffffe660 = (uint256 *)local_c58;
    in_stack_ffffffffffffe658 =
         "get_valid_opts({(\"-minimumchainwork=\" + minimum_chainwork).c_str()}).minimum_chain_work"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::optional<arith_uint256>,arith_uint256>
              (local_1468,local_1478,0x33c,1,2,local_bd4);
    kernel::ChainstateManagerOpts::~ChainstateManagerOpts
              ((ChainstateManagerOpts *)in_stack_ffffffffffffe658);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe668);
    std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe658);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffe658);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffe698,in_stack_ffffffffffffe690,
               (size_t)in_stack_ffffffffffffe688,
               (const_string *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    std::allocator<const_char_*>::allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    __l_10._M_array._7_1_ = in_stack_ffffffffffffe6a7;
    __l_10._M_array._0_7_ = in_stack_ffffffffffffe6a0;
    __l_10._M_len = (size_type)in_stack_ffffffffffffe6a8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698,
               __l_10,(allocator_type *)in_stack_ffffffffffffe690);
    test_method::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)
               CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
               (vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe698);
    util::Result::operator_cast_to_bool
              ((Result<kernel::ChainstateManagerOpts> *)in_stack_ffffffffffffe658);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe668,
               SUB81((ulong)in_stack_ffffffffffffe660 >> 0x38,0));
    in_stack_ffffffffffffe6a8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe660,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    in_stack_ffffffffffffe658 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_14d0,local_1510,local_1530,0x33e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe658);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe658);
    util::Result<kernel::ChainstateManagerOpts>::~Result
              ((Result<kernel::ChainstateManagerOpts> *)in_stack_ffffffffffffe658);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe668);
    std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    in_stack_ffffffffffffe6a7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffe6a7);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,in_stack_ffffffffffffe690,
               (size_t)in_stack_ffffffffffffe688,
               (const_string *)CONCAT17(in_stack_ffffffffffffe687,in_stack_ffffffffffffe680));
    in_stack_ffffffffffffe690 = &local_1581;
    std::allocator<const_char_*>::allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    __l_11._M_array._7_1_ = in_stack_ffffffffffffe6a7;
    __l_11._M_array._0_7_ = in_stack_ffffffffffffe6a0;
    __l_11._M_len = (size_type)in_stack_ffffffffffffe6a8;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              (this_00,__l_11,(allocator_type *)in_stack_ffffffffffffe690);
    test_method::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)
               CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),this_00);
    util::Result::operator_cast_to_bool
              ((Result<kernel::ChainstateManagerOpts> *)in_stack_ffffffffffffe658);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffe668,
               SUB81((ulong)in_stack_ffffffffffffe660 >> 0x38,0));
    in_stack_ffffffffffffe688 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffe660,
               (basic_cstring<const_char> *)in_stack_ffffffffffffe658);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe668,
               (pointer)in_stack_ffffffffffffe660,(unsigned_long)in_stack_ffffffffffffe658);
    in_stack_ffffffffffffe658 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1568,local_15a8,local_15c8,0x33f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe658);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe658);
    util::Result<kernel::ChainstateManagerOpts>::~Result
              ((Result<kernel::ChainstateManagerOpts> *)in_stack_ffffffffffffe658);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffe668);
    std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)in_stack_ffffffffffffe658);
    in_stack_ffffffffffffe687 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffe687);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe658);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe658);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstatemanager_args, BasicTestingSetup)
{
    //! Try to apply the provided args to a ChainstateManager::Options
    auto get_opts = [&](const std::vector<const char*>& args) {
        static kernel::Notifications notifications{};
        static const ChainstateManager::Options options{
            .chainparams = ::Params(),
            .datadir = {},
            .notifications = notifications};
        return SetOptsFromArgs(*this->m_node.args, options, args);
    };
    //! Like get_opts, but requires the provided args to be valid and unwraps the result
    auto get_valid_opts = [&](const std::vector<const char*>& args) {
        const auto result{get_opts(args)};
        BOOST_REQUIRE_MESSAGE(result, util::ErrorString(result).original);
        return *result;
    };

    // test -assumevalid
    BOOST_CHECK(!get_valid_opts({}).assumed_valid_block);
    BOOST_CHECK_EQUAL(get_valid_opts({"-assumevalid="}).assumed_valid_block, uint256::ZERO);
    BOOST_CHECK_EQUAL(get_valid_opts({"-assumevalid=0"}).assumed_valid_block, uint256::ZERO);
    BOOST_CHECK_EQUAL(get_valid_opts({"-noassumevalid"}).assumed_valid_block, uint256::ZERO);
    BOOST_CHECK_EQUAL(get_valid_opts({"-assumevalid=0x12"}).assumed_valid_block, uint256{0x12});

    std::string assume_valid{"0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef"};
    BOOST_CHECK_EQUAL(get_valid_opts({("-assumevalid=" + assume_valid).c_str()}).assumed_valid_block, uint256::FromHex(assume_valid));

    BOOST_CHECK(!get_opts({"-assumevalid=xyz"}));                                                               // invalid hex characters
    BOOST_CHECK(!get_opts({"-assumevalid=01234567890123456789012345678901234567890123456789012345678901234"})); // > 64 hex chars

    // test -minimumchainwork
    BOOST_CHECK(!get_valid_opts({}).minimum_chain_work);
    BOOST_CHECK_EQUAL(get_valid_opts({"-minimumchainwork=0"}).minimum_chain_work, arith_uint256());
    BOOST_CHECK_EQUAL(get_valid_opts({"-nominimumchainwork"}).minimum_chain_work, arith_uint256());
    BOOST_CHECK_EQUAL(get_valid_opts({"-minimumchainwork=0x1234"}).minimum_chain_work, arith_uint256{0x1234});

    std::string minimum_chainwork{"0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef"};
    BOOST_CHECK_EQUAL(get_valid_opts({("-minimumchainwork=" + minimum_chainwork).c_str()}).minimum_chain_work, UintToArith256(uint256::FromHex(minimum_chainwork).value()));

    BOOST_CHECK(!get_opts({"-minimumchainwork=xyz"}));                                                               // invalid hex characters
    BOOST_CHECK(!get_opts({"-minimumchainwork=01234567890123456789012345678901234567890123456789012345678901234"})); // > 64 hex chars
}